

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsimplifier.h
# Opt level: O2

void __thiscall
soplex::
SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxSimplifier(SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,char *p_name,TYPE ttype)

{
  Timer *pTVar1;
  
  this->_vptr_SPxSimplifier = (_func_int **)&PTR__SPxSimplifier_00541f50;
  this->m_name = p_name;
  this->m_timeUsed = (Timer *)0x0;
  this->m_timerType = ttype;
  this->m_remRows = 0;
  this->m_remCols = 0;
  this->m_remNzos = 0;
  this->m_chgBnds = 0;
  this->m_chgBnds = 0;
  this->m_chgLRhs = 0;
  this->m_keptBnds = 0;
  this->m_keptLRhs = 0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&(this->m_objoffset).m_backend,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&(this->m_minReduction).m_backend,0.0001,(type *)0x0);
  this->spxout = (SPxOut *)0x0;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pTVar1 = TimerFactory::createTimer(ttype);
  this->m_timeUsed = pTVar1;
  return;
}

Assistant:

explicit SPxSimplifier(const char* p_name, Timer::TYPE ttype = Timer::USER_TIME)
      : m_name(p_name)
      , m_timeUsed(nullptr)
      , m_timerType(ttype)
      , m_remRows(0)
      , m_remCols(0)
      , m_remNzos(0)
      , m_chgBnds(0)
      , m_chgLRhs(0)
      , m_keptBnds(0)
      , m_keptLRhs(0)
      , m_objoffset(0.0)
      , m_minReduction(1e-4)
      , spxout(nullptr)
   {
      assert(isConsistent());

      m_timeUsed = TimerFactory::createTimer(ttype);
   }